

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::IndexedStateQueryTests::init
          (IndexedStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType QVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  int iVar4;
  TestCase *pTVar5;
  char *pcVar6;
  MinValueIndexed3Case *pMVar7;
  BufferBindingCase *pBVar8;
  BufferStartCase *pBVar9;
  BufferSizeCase *pBVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  TestNode *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long local_48;
  IVec3 local_3c;
  
  local_90 = (TestNode *)this;
  for (lVar11 = 0; pTVar3 = local_90, lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)pTVar3[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"sample_mask_value_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test SAMPLE_MASK_VALUE");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58c18;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0xffffffff;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pMVar7 = (MinValueIndexed3Case *)operator_new(0x90);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"max_compute_work_group_count_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    local_3c.m_data[0] = 0xffff;
    local_3c.m_data[1] = 0xffff;
    local_3c.m_data[2] = 0xffff;
    anon_unknown_1::MinValueIndexed3Case::MinValueIndexed3Case
              (pMVar7,pCVar2,local_88._M_dataplus._M_p,"Test MAX_COMPUTE_WORK_GROUP_COUNT",0x91be,
               &local_3c,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pMVar7 = (MinValueIndexed3Case *)operator_new(0x90);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"max_compute_work_group_size_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    local_3c.m_data[0] = 0x80;
    local_3c.m_data[1] = 0x80;
    local_3c.m_data[2] = 0x40;
    anon_unknown_1::MinValueIndexed3Case::MinValueIndexed3Case
              (pMVar7,pCVar2,local_88._M_dataplus._M_p,"Test MAX_COMPUTE_WORK_GROUP_SIZE",0x91bf,
               &local_3c,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pBVar8 = (BufferBindingCase *)operator_new(0x88);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"atomic_counter_buffer_binding_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferBindingCase::BufferBindingCase
              (pBVar8,pCVar2,local_88._M_dataplus._M_p,"Test ATOMIC_COUNTER_BUFFER_BINDING",0x92c1,
               0x92c0,0x92dc,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pBVar9 = (BufferStartCase *)operator_new(0x88);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"atomic_counter_buffer_start_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferStartCase::BufferStartCase
              (pBVar9,pCVar2,local_88._M_dataplus._M_p,"Test ATOMIC_COUNTER_BUFFER_START",0x92c2,
               0x92c0,0x92dc,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pBVar10 = (BufferSizeCase *)operator_new(0x88);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"atomic_counter_buffer_size_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferSizeCase::BufferSizeCase
              (pBVar10,pCVar2,local_88._M_dataplus._M_p,"Test ATOMIC_COUNTER_BUFFER_SIZE",0x92c3,
               0x92c0,0x92dc,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pBVar8 = (BufferBindingCase *)operator_new(0x88);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"shader_storage_buffer_binding_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferBindingCase::BufferBindingCase
              (pBVar8,pCVar2,local_88._M_dataplus._M_p,"Test SHADER_STORAGE_BUFFER_BINDING",0x90d3,
               0x90d2,0x90dd,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pBVar9 = (BufferStartCase *)operator_new(0x88);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"shader_storage_buffer_start_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferStartCase::BufferStartCase
              (pBVar9,pCVar2,local_88._M_dataplus._M_p,"Test SHADER_STORAGE_BUFFER_START",0x90d4,
               0x90d2,0x90dd,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  lVar11 = 0;
  while (pTVar3 = local_90, lVar11 != 0xc) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    local_48 = lVar11;
    pBVar10 = (BufferSizeCase *)operator_new(0x88);
    pCVar2 = (Context *)pTVar3[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"shader_storage_buffer_size_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    anon_unknown_1::BufferSizeCase::BufferSizeCase
              (pBVar10,pCVar2,local_88._M_dataplus._M_p,"Test SHADER_STORAGE_BUFFER_SIZE",0x90d5,
               0x90d2,0x90dd,QVar1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
    lVar11 = local_48 + 4;
  }
  for (lVar11 = 0; pTVar3 = local_90, lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)pTVar3[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_name_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_NAME");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58da8;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pTVar3 = local_90;
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_level_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_LEVEL");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58df8;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_layered_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_LAYERED")
    ;
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58e48;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_layer_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_LAYER");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58e98;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_access_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_ACCESS");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58ee8;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"image_binding_format_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"Test IMAGE_BINDING_FORMAT");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58f38;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  pTVar5 = (TestCase *)operator_new(0x80);
  pCVar2 = (Context *)local_90[1]._vptr_TestNode;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_68,&local_b0,"blend_");
  std::operator+(&local_88,&local_68,"isenabledi");
  gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"BLEND");
  (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58f88;
  *(undefined4 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 8;
  tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar11 = 0;
  while (lVar11 != 0xc) {
    QVar1 = *(QueryType *)((long)init::vec4Verifiers + lVar11);
    local_48 = lVar11;
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"color_mask_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"COLOR_WRITEMASK");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e58fd8;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
    lVar11 = local_48 + 4;
  }
  iVar4 = 0xc;
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"blend_func_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase(pTVar5,pCVar2,local_88._M_dataplus._M_p,"BLEND_SRC and BLEND_DST");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e59028;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    iVar4 = std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"blend_equation_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase
              (pTVar5,pCVar2,local_88._M_dataplus._M_p,"BLEND_EQUATION_RGB and BLEND_DST");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e59078;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    iVar4 = std::__cxx11::string::~string((string *)&local_b0);
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
    QVar1 = *(QueryType *)((long)init::verifiers + lVar11);
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar2 = (Context *)local_90[1]._vptr_TestNode;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_68,&local_b0,"blend_equation_advanced_");
    pcVar6 = anon_unknown_1::getVerifierSuffix(QVar1);
    std::operator+(&local_88,&local_68,pcVar6);
    gles31::TestCase::TestCase
              (pTVar5,pCVar2,local_88._M_dataplus._M_p,"BLEND_EQUATION_RGB and BLEND_DST");
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e590c8;
    *(QueryType *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    iVar4 = std::__cxx11::string::~string((string *)&local_b0);
  }
  return iVar4;
}

Assistant:

void IndexedStateQueryTests::init (void)
{
	static const QueryType verifiers[] = { QUERY_INDEXED_BOOLEAN, QUERY_INDEXED_INTEGER, QUERY_INDEXED_INTEGER64 };
	static const QueryType vec4Verifiers[] = { QUERY_INDEXED_BOOLEAN_VEC4, QUERY_INDEXED_INTEGER_VEC4, QUERY_INDEXED_INTEGER64_VEC4 };

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const QueryType verifier = verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);							\
		this->addChild(X);																	\
	}

#define FOR_EACH_VEC4_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(vec4Verifiers); ++verifierNdx)	\
	{																							\
		const QueryType verifier = vec4Verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);								\
		this->addChild(X);																		\
	}

	FOR_EACH_VERIFIER(new SampleMaskCase			(m_context, (std::string() + "sample_mask_value_" + verifierSuffix).c_str(),				"Test SAMPLE_MASK_VALUE", verifier))

	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_count_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_COUNT",	GL_MAX_COMPUTE_WORK_GROUP_COUNT,	tcu::IVec3(65535,65535,65535),	verifier))
	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_size_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_SIZE",		GL_MAX_COMPUTE_WORK_GROUP_SIZE,		tcu::IVec3(128, 128, 64),		verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "atomic_counter_buffer_binding_" + verifierSuffix).c_str(),	"Test ATOMIC_COUNTER_BUFFER_BINDING",	GL_ATOMIC_COUNTER_BUFFER_BINDING,	GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "atomic_counter_buffer_start_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_START",		GL_ATOMIC_COUNTER_BUFFER_START,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "atomic_counter_buffer_size_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_SIZE",		GL_ATOMIC_COUNTER_BUFFER_SIZE,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "shader_storage_buffer_binding_" + verifierSuffix).c_str(),	"Test SHADER_STORAGE_BUFFER_BINDING",	GL_SHADER_STORAGE_BUFFER_BINDING,	GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "shader_storage_buffer_start_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_START",		GL_SHADER_STORAGE_BUFFER_START,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "shader_storage_buffer_size_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_SIZE",		GL_SHADER_STORAGE_BUFFER_SIZE,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new ImageBindingNameCase		(m_context, (std::string() + "image_binding_name_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_NAME",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLevelCase		(m_context, (std::string() + "image_binding_level_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LEVEL",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayeredCase	(m_context, (std::string() + "image_binding_layered_" + verifierSuffix).c_str(),			"Test IMAGE_BINDING_LAYERED",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayerCase		(m_context, (std::string() + "image_binding_layer_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LAYER",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingAccessCase	(m_context, (std::string() + "image_binding_access_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_ACCESS",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingFormatCase	(m_context, (std::string() + "image_binding_format_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_FORMAT",			verifier))

	{
		const QueryType verifier = QUERY_INDEXED_ISENABLED;
		const char* verifierSuffix = getVerifierSuffix(verifier);
		this->addChild(new EnableBlendCase			(m_context, (std::string() + "blend_" + verifierSuffix).c_str(),							"BLEND",								verifier));
	}
	FOR_EACH_VEC4_VERIFIER(new ColorMaskCase		(m_context, (std::string() + "color_mask_" + verifierSuffix).c_str(),						"COLOR_WRITEMASK",						verifier))
	FOR_EACH_VERIFIER(new BlendFuncCase				(m_context, (std::string() + "blend_func_" + verifierSuffix).c_str(),						"BLEND_SRC and BLEND_DST",				verifier))
	FOR_EACH_VERIFIER(new BlendEquationCase			(m_context, (std::string() + "blend_equation_" + verifierSuffix).c_str(),					"BLEND_EQUATION_RGB and BLEND_DST",		verifier))
	FOR_EACH_VERIFIER(new BlendEquationAdvancedCase	(m_context, (std::string() + "blend_equation_advanced_" + verifierSuffix).c_str(),			"BLEND_EQUATION_RGB and BLEND_DST",		verifier))

#undef FOR_EACH_VEC4_VERIFIER
#undef FOR_EACH_VERIFIER
}